

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void add_cpreg_to_hashtable
               (ARMCPU_conflict1 *cpu,ARMCPRegInfo_conflict *r,void *opaque,int state,int secstate,
               int crm,int opc1,int opc2,char *name)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint *key_00;
  undefined8 *value;
  char *pcVar4;
  undefined8 *puVar5;
  ARMCPRegInfo_conflict *oldreg;
  int ns;
  int is64;
  ARMCPRegInfo_conflict *r2;
  uint32_t *key;
  int crm_local;
  int secstate_local;
  int state_local;
  void *opaque_local;
  ARMCPRegInfo_conflict *r_local;
  ARMCPU_conflict1 *cpu_local;
  
  key_00 = (uint *)g_malloc_n(1,4);
  value = (undefined8 *)g_memdup(r,0x88);
  uVar1 = (uint)((r->type & 4U) != 0);
  uVar2 = (uint)((secstate & 2U) != 0);
  pcVar4 = g_strdup(name);
  *value = pcVar4;
  *(int *)((long)value + 0x1c) = secstate;
  if ((r->bank_fieldoffsets[0] != 0) && (r->bank_fieldoffsets[1] != 0)) {
    value[6] = r->bank_fieldoffsets[(int)uVar2];
  }
  if (state == 0) {
    if ((r->bank_fieldoffsets[0] == 0) || (r->bank_fieldoffsets[1] == 0)) {
      if ((secstate != r->secure) && (uVar2 == 0)) {
        *(uint *)((long)value + 0x14) = *(uint *)((long)value + 0x14) | 0x20;
      }
    }
    else if (((r->state == 2) && (uVar2 != 0)) ||
            ((iVar3 = arm_feature(&cpu->env,0x1b), iVar3 != 0 && (uVar2 == 0)))) {
      *(uint *)((long)value + 0x14) = *(uint *)((long)value + 0x14) | 0x20;
    }
    if ((r->state == 2) && (*(char *)(value + 1) == '\0')) {
      *(undefined1 *)(value + 1) = 0xf;
    }
  }
  if (state == 1) {
    if ((r->cp == '\0') || (r->state == 2)) {
      *(undefined1 *)(value + 1) = 0x13;
    }
    *key_00 = (uint)*(byte *)(value + 1) << 0x10 | 0x10000000 |
              (uint)*(byte *)((long)value + 0xb) << 0xe | opc1 << 0xb |
              (uint)*(byte *)((long)value + 9) << 7 | crm << 3 | opc2;
  }
  else {
    *key_00 = uVar2 << 0x1d | (uint)*(byte *)(value + 1) << 0x10 | uVar1 << 0xf |
              (uint)*(byte *)((long)value + 9) << 0xb | crm << 7 | opc1 << 3 | opc2;
  }
  if (opaque != (void *)0x0) {
    value[4] = opaque;
  }
  *(int *)(value + 2) = state;
  *(char *)((long)value + 10) = (char)crm;
  *(char *)((long)value + 0xc) = (char)opc1;
  *(char *)((long)value + 0xd) = (char)opc2;
  if ((r->type & 1U) != 0) {
    *(uint *)((long)value + 0x14) = *(uint *)((long)value + 0x14) | 0x80;
  }
  if ((((r->crm == 0xff) && (crm != 0)) || ((r->opc1 == 0xff && (opc1 != 0)))) ||
     ((r->opc2 == 0xff && (opc2 != 0)))) {
    *(uint *)((long)value + 0x14) = *(uint *)((long)value + 0x14) | 0x4020;
  }
  if ((((r->type & 0x10U) == 0) &&
      (puVar5 = (undefined8 *)g_hash_table_lookup(cpu->cp_regs,key_00), puVar5 != (undefined8 *)0x0)
      ) && ((*(uint *)((long)puVar5 + 0x14) & 0x10) == 0)) {
    fprintf(_stderr,
            "Register redefined: cp=%d %d bit crn=%d crm=%d opc1=%d opc2=%d, was %s, now %s\n",
            (ulong)*(byte *)(value + 1),(ulong)(uVar1 * 0x20 + 0x20),
            (ulong)*(byte *)((long)value + 9),(ulong)*(byte *)((long)value + 10),
            (uint)*(byte *)((long)value + 0xc),(uint)*(byte *)((long)value + 0xd),*puVar5,*value);
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
               ,0x1dc0,(char *)0x0);
  }
  g_hash_table_insert(cpu->cp_regs,key_00,value);
  return;
}

Assistant:

static void add_cpreg_to_hashtable(ARMCPU *cpu, const ARMCPRegInfo *r,
                                   void *opaque, int state, int secstate,
                                   int crm, int opc1, int opc2,
                                   const char *name)
{
    /* Private utility function for define_one_arm_cp_reg_with_opaque():
     * add a single reginfo struct to the hash table.
     */
    uint32_t *key = g_new(uint32_t, 1);
    ARMCPRegInfo *r2 = g_memdup(r, sizeof(ARMCPRegInfo));
    int is64 = (r->type & ARM_CP_64BIT) ? 1 : 0;
    int ns = (secstate & ARM_CP_SECSTATE_NS) ? 1 : 0;

    r2->name = g_strdup(name);
    /* Reset the secure state to the specific incoming state.  This is
     * necessary as the register may have been defined with both states.
     */
    r2->secure = secstate;

    if (r->bank_fieldoffsets[0] && r->bank_fieldoffsets[1]) {
        /* Register is banked (using both entries in array).
         * Overwriting fieldoffset as the array is only used to define
         * banked registers but later only fieldoffset is used.
         */
        r2->fieldoffset = r->bank_fieldoffsets[ns];
    }

    if (state == ARM_CP_STATE_AA32) {
        if (r->bank_fieldoffsets[0] && r->bank_fieldoffsets[1]) {
            /* If the register is banked then we don't need to migrate or
             * reset the 32-bit instance in certain cases:
             *
             * 1) If the register has both 32-bit and 64-bit instances then we
             *    can count on the 64-bit instance taking care of the
             *    non-secure bank.
             * 2) If ARMv8 is enabled then we can count on a 64-bit version
             *    taking care of the secure bank.  This requires that separate
             *    32 and 64-bit definitions are provided.
             */
            if ((r->state == ARM_CP_STATE_BOTH && ns) ||
                (arm_feature(&cpu->env, ARM_FEATURE_V8) && !ns)) {
                r2->type |= ARM_CP_ALIAS;
            }
        } else if ((secstate != r->secure) && !ns) {
            /* The register is not banked so we only want to allow migration of
             * the non-secure instance.
             */
            r2->type |= ARM_CP_ALIAS;
        }

        if (r->state == ARM_CP_STATE_BOTH) {
            /* We assume it is a cp15 register if the .cp field is left unset.
             */
            if (r2->cp == 0) {
                r2->cp = 15;
            }

#ifdef HOST_WORDS_BIGENDIAN
            if (r2->fieldoffset) {
                r2->fieldoffset += sizeof(uint32_t);
            }
#endif
        }
    }
    if (state == ARM_CP_STATE_AA64) {
        /* To allow abbreviation of ARMCPRegInfo
         * definitions, we treat cp == 0 as equivalent to
         * the value for "standard guest-visible sysreg".
         * STATE_BOTH definitions are also always "standard
         * sysreg" in their AArch64 view (the .cp value may
         * be non-zero for the benefit of the AArch32 view).
         */
        if (r->cp == 0 || r->state == ARM_CP_STATE_BOTH) {
            r2->cp = CP_REG_ARM64_SYSREG_CP;
        }
        *key = ENCODE_AA64_CP_REG(r2->cp, r2->crn, crm,
                                  r2->opc0, opc1, opc2);
    } else {
        *key = ENCODE_CP_REG(r2->cp, is64, ns, r2->crn, crm, opc1, opc2);
    }
    if (opaque) {
        r2->opaque = opaque;
    }
    /* reginfo passed to helpers is correct for the actual access,
     * and is never ARM_CP_STATE_BOTH:
     */
    r2->state = state;
    /* Make sure reginfo passed to helpers for wildcarded regs
     * has the correct crm/opc1/opc2 for this reg, not CP_ANY:
     */
    r2->crm = crm;
    r2->opc1 = opc1;
    r2->opc2 = opc2;
    /* By convention, for wildcarded registers only the first
     * entry is used for migration; the others are marked as
     * ALIAS so we don't try to transfer the register
     * multiple times. Special registers (ie NOP/WFI) are
     * never migratable and not even raw-accessible.
     */
    if ((r->type & ARM_CP_SPECIAL)) {
        r2->type |= ARM_CP_NO_RAW;
    }
    if (((r->crm == CP_ANY) && crm != 0) ||
        ((r->opc1 == CP_ANY) && opc1 != 0) ||
        ((r->opc2 == CP_ANY) && opc2 != 0)) {
        r2->type |= ARM_CP_ALIAS | ARM_CP_NO_GDB;
    }

    /* Check that raw accesses are either forbidden or handled. Note that
     * we can't assert this earlier because the setup of fieldoffset for
     * banked registers has to be done first.
     */
    if (!(r2->type & ARM_CP_NO_RAW)) {
        // assert(!raw_accessors_invalid(r2));
    }

    /* Overriding of an existing definition must be explicitly
     * requested.
     */
    if (!(r->type & ARM_CP_OVERRIDE)) {
        ARMCPRegInfo *oldreg;
        oldreg = g_hash_table_lookup(cpu->cp_regs, key);
        if (oldreg && !(oldreg->type & ARM_CP_OVERRIDE)) {
            fprintf(stderr, "Register redefined: cp=%d %d bit "
                    "crn=%d crm=%d opc1=%d opc2=%d, "
                    "was %s, now %s\n", r2->cp, 32 + 32 * is64,
                    r2->crn, r2->crm, r2->opc1, r2->opc2,
                    oldreg->name, r2->name);
            g_assert_not_reached();
        }
    }
    g_hash_table_insert(cpu->cp_regs, key, r2);
}